

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O0

void Gia_ManPrintFlopClasses(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int Counter1;
  int Counter0;
  Gia_Man_t *p_local;
  
  if (p->vFlopClasses != (Vec_Int_t *)0x0) {
    iVar1 = Vec_IntSize(p->vFlopClasses);
    iVar2 = Gia_ManRegNum(p);
    if (iVar1 == iVar2) {
      uVar3 = Vec_IntCountEntry(p->vFlopClasses,0);
      uVar4 = Vec_IntCountEntry(p->vFlopClasses,1);
      printf("Flop-level abstraction:  Excluded FFs = %d  Included FFs = %d  (%.2f %%) ",
             ((double)(int)uVar4 * 100.0) / (double)(int)(uVar3 + uVar4 + 1),(ulong)uVar3,
             (ulong)uVar4);
      iVar1 = Gia_ManRegNum(p);
      if ((int)(uVar3 + uVar4) < iVar1) {
        printf("and there are other FF classes...");
      }
      printf("\n");
    }
    else {
      printf(
            "Gia_ManPrintFlopClasses(): The number of flop map entries differs from the number of flops.\n"
            );
    }
  }
  return;
}

Assistant:

void Gia_ManPrintFlopClasses( Gia_Man_t * p )
{
    int Counter0, Counter1;
    if ( p->vFlopClasses == NULL )
        return;
    if ( Vec_IntSize(p->vFlopClasses) != Gia_ManRegNum(p) )
    {
        printf( "Gia_ManPrintFlopClasses(): The number of flop map entries differs from the number of flops.\n" );
        return;
    }
    Counter0 = Vec_IntCountEntry( p->vFlopClasses, 0 );
    Counter1 = Vec_IntCountEntry( p->vFlopClasses, 1 );
    printf( "Flop-level abstraction:  Excluded FFs = %d  Included FFs = %d  (%.2f %%) ", 
        Counter0, Counter1, 100.0*Counter1/(Counter0 + Counter1 + 1) );
    if ( Counter0 + Counter1 < Gia_ManRegNum(p) )
        printf( "and there are other FF classes..." );
    printf( "\n" );
}